

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
          (CodedInputStream *this,uint64 *value)

{
  bool bVar1;
  uint64 *buffer;
  uint64 local_20;
  uint8 bytes [8];
  
  buffer = (uint64 *)this->buffer_;
  if ((*(int *)&this->buffer_end_ - (int)buffer & 0xfffffff8U) == 0) {
    buffer = &local_20;
    bVar1 = ReadRaw(this,buffer,8);
    if (!bVar1) {
      return false;
    }
  }
  else {
    this->buffer_ = (uint8 *)(buffer + 1);
  }
  *value = *buffer;
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian64Fallback(uint64* value) {
  uint8 bytes[sizeof(*value)];

  const uint8* ptr;
  if (BufferSize() >= sizeof(*value)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(sizeof(*value));
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, sizeof(*value))) return false;
    ptr = bytes;
  }
  ReadLittleEndian64FromArray(ptr, value);
  return true;
}